

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osdtext.cpp
# Opt level: O1

void __thiscall CS248::OSDText::~OSDText(OSDText *this)

{
  if (this->ft != (FT_Library *)0x0) {
    operator_delete(this->ft);
  }
  if (this->face != (FT_Face_conflict *)0x0) {
    operator_delete(this->face);
  }
  if (this->font != (char *)0x0) {
    operator_delete__(this->font);
  }
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::clear(&this->lines);
  (*__glewDeleteProgram)(this->program);
  std::vector<CS248::OSDLine,_std::allocator<CS248::OSDLine>_>::~vector(&this->lines);
  return;
}

Assistant:

OSDText::~OSDText() {

  delete ft;
  delete face;
  delete [] font;

  lines.clear();

  glDeleteProgram(program);
}